

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_968e7b::TLL::AppendProperty(TLL *this,string *prop,string *value)

{
  cmTarget *this_00;
  string *value_00;
  string *prop_00;
  undefined1 local_48 [40];
  string *local_20;
  string *value_local;
  string *prop_local;
  TLL *this_local;
  
  local_20 = value;
  value_local = prop;
  prop_local = (string *)this;
  AffectsProperty(this,prop);
  prop_00 = value_local;
  value_00 = local_20;
  this_00 = this->Target;
  cmMakefile::GetBacktrace((cmMakefile *)local_48);
  std::optional<cmListFileBacktrace>::optional<cmListFileBacktrace,_true>
            ((optional<cmListFileBacktrace> *)(local_48 + 0x10),(cmListFileBacktrace *)local_48);
  cmTarget::AppendProperty
            (this_00,prop_00,value_00,(optional<cmListFileBacktrace> *)(local_48 + 0x10),false);
  std::optional<cmListFileBacktrace>::~optional((optional<cmListFileBacktrace> *)(local_48 + 0x10));
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_48);
  return;
}

Assistant:

void TLL::AppendProperty(std::string const& prop, std::string const& value)
{
  this->AffectsProperty(prop);
  this->Target->AppendProperty(prop, value, this->Makefile.GetBacktrace());
}